

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  secp256k1_context *psVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  secp256k1_pubkey *message;
  size_t n_pubkeys;
  secp256k1_scalar *extraout_RDX;
  secp256k1_scalar *sigr;
  secp256k1_scalar *psVar8;
  secp256k1_scalar *seckey;
  uint uVar9;
  undefined1 *puVar10;
  secp256k1_ge *ge_00;
  secp256k1_scalar *sigs;
  secp256k1_context *psVar11;
  ulong uVar12;
  ulong uVar13;
  int *recid;
  byte bVar14;
  undefined1 *unaff_R12;
  secp256k1_ge *pubkey_00;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  secp256k1_ge *psVar15;
  uint uVar16;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  secp256k1_ge ge;
  secp256k1_scalar sStack_270;
  secp256k1_ge *psStack_248;
  secp256k1_ge *psStack_240;
  secp256k1_context *psStack_238;
  secp256k1_ge *psStack_230;
  code *pcStack_228;
  secp256k1_pubkey *apsStack_220 [5];
  undefined1 *puStack_1f8;
  secp256k1_ge *psStack_1f0;
  char local_1e1;
  undefined8 local_1e0;
  undefined1 local_1d8 [65];
  byte abStack_197 [7];
  secp256k1_ge *psStack_190;
  uint64_t local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  size_t local_148;
  int local_140;
  uint local_13c;
  secp256k1_ge *local_138;
  ulong local_130;
  undefined1 local_128 [105];
  undefined8 uStack_bf;
  uint64_t local_b7;
  uint64_t uStack_af;
  secp256k1_ge local_98;
  
  local_148 = 3;
  local_1d8._56_4_ = xvalid;
  local_140 = yvalid;
  local_138 = (secp256k1_ge *)input;
LAB_00151fdc:
  local_128._65_8_ = (((secp256k1_ge *)input)->x).n[0];
  local_128._73_8_ = (((secp256k1_ge *)input)->x).n[1];
  local_128._81_8_ = (((secp256k1_ge *)input)->x).n[2];
  local_128._89_8_ = (((secp256k1_ge *)input)->x).n[3];
  local_128._97_8_ = (((secp256k1_ge *)input)->x).n[4];
  uStack_bf._0_4_ = (((secp256k1_ge *)input)->x).magnitude;
  uStack_bf._4_4_ = (((secp256k1_ge *)input)->x).normalized;
  local_b7 = (((secp256k1_ge *)input)->y).n[0];
  uStack_af = (((secp256k1_ge *)input)->y).n[1];
  local_1e1 = local_1d8._56_4_ != 0 && local_148 == 0x21;
  local_13c = (uint)(local_148 == 0x41) * 4;
  local_130 = (ulong)(local_148 == 0x41 || local_148 == 0x21);
  puVar10 = (undefined1 *)0x0;
  while( true ) {
    output = (secp256k1_ge *)(local_1d8 + 0x40);
    local_128[0x40] = (char)puVar10;
    uVar9 = (uint)puVar10;
    uVar16 = *(uchar *)((long)(((secp256k1_ge *)input)->y).n + 0xf) & 1 | 2;
    output_00 = (secp256k1_ge *)(ulong)uVar16;
    if ((local_1d8._56_4_ == 0 || local_140 == 0) || (uVar9 & 4) != local_13c) {
      pubkey_00 = (secp256k1_ge *)0x0;
    }
    else {
      pubkey_00 = (secp256k1_ge *)
                  CONCAT71((int7)((ulong)unaff_R12 >> 8),
                           ((uVar9 & 0xfb) == uVar16 || uVar9 == 4) & (byte)local_130);
    }
    bVar14 = (byte)pubkey_00;
    psVar11 = CTX;
    if (((local_1e1 != '\0' && (uVar9 & 0xfe) == 2) | bVar14) != 1) break;
    local_128._0_8_ = 0;
    local_128._8_8_ = 0;
    local_128._16_8_ = 0;
    local_128._24_8_ = 0;
    local_128._32_8_ = 0;
    local_128._40_4_ = 0;
    local_128._44_4_ = 0;
    local_128._48_8_ = 0;
    local_128._56_8_ = 0;
    stack0xfffffffffffffe68 = (_func_void_char_ptr_void_ptr *)0x4d430001;
    local_188 = 0x40;
    local_180._0_4_ = 0;
    local_180._4_4_ = 0;
    local_178._0_4_ = 0;
    local_178._4_4_ = 0;
    local_170 = 0;
    local_1d8._0_8_ = 0;
    psStack_1f0 = (secp256k1_ge *)0x1521b4;
    ge_00 = (secp256k1_ge *)local_128;
    psStack_190 = (secp256k1_ge *)local_128;
    iVar5 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)local_128,local_128 + 0x40,local_148);
    input = (uchar *)local_128;
    if (iVar5 == 0) {
LAB_001526f8:
      psStack_1f0 = (secp256k1_ge *)0x1526fd;
      ec_pubkey_parse_pointtest_cold_14();
      psVar15 = (secp256k1_ge *)input;
LAB_001526fd:
      psStack_1f0 = (secp256k1_ge *)0x152702;
      ec_pubkey_parse_pointtest_cold_13();
      input = (uchar *)psVar15;
LAB_00152702:
      psStack_1f0 = (secp256k1_ge *)0x152707;
      ec_pubkey_parse_pointtest_cold_2();
      goto LAB_00152707;
    }
    stack0xfffffffffffffe68 = (_func_void_char_ptr_void_ptr *)0x4d430005;
    local_188 = 0x40;
    local_180._0_4_ = 0;
    local_180._4_4_ = 0;
    local_178._0_4_ = 0;
    local_178._4_4_ = 0;
    local_170 = 0;
    local_1d8._48_8_ = 0x41;
    local_1d8._0_8_ = 0x4d430001;
    local_1d8._16_8_ = 0x41;
    local_1d8._24_8_ = 0;
    local_1d8._32_8_ = 0;
    local_1d8._40_4_ = 0;
    local_1d8._44_4_ = 0;
    puVar10 = local_1d8;
    local_1e0 = 0;
    uVar12 = 0x102;
    psStack_1f0 = (secp256k1_ge *)0x152278;
    ge_00 = output;
    psVar11 = CTX;
    local_1d8._8_8_ = output;
    local_1d8._60_4_ = uVar9;
    psStack_190 = (secp256k1_ge *)local_128;
    iVar5 = secp256k1_ec_pubkey_serialize
                      (CTX,(uchar *)output,(size_t *)(local_1d8 + 0x30),
                       (secp256k1_pubkey *)local_128,0x102);
    input = (uchar *)local_138;
    psVar15 = (secp256k1_ge *)local_128;
    if (iVar5 == 0) goto LAB_001526fd;
    local_1d8._0_8_ = 0x4d430005;
    local_1d8._8_8_ = output;
    local_1d8._16_8_ = local_1d8._48_8_;
    local_1d8._24_8_ = 0;
    local_1d8._32_8_ = 0;
    local_1d8._40_4_ = 0;
    local_1d8._44_4_ = 0;
    uVar13 = (ulong)((long)psVar11 << 3) >> 0x33;
    uVar3 = (((long)psVar11 << 3 | (ulong)psVar11 >> 0x3d) << 0xd | uVar13) >> 3;
    psVar11 = (secp256k1_context *)(uVar3 << 0x33 | (uVar13 << 0x3d | uVar3) >> 0xd);
    local_1e0 = 0;
    if (local_1d8._48_8_ != 0x21) goto LAB_0015270c;
    lVar6 = 1;
    puVar10 = (undefined1 *)(ulong)(uint)local_1d8._60_4_;
    do {
      bVar1 = local_1d8[lVar6 + 0x40];
      ge_00 = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = local_128[lVar6 + 0x40];
      psVar11 = (secp256k1_context *)(ulong)bVar2;
      uVar13 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar13 = uVar12 & 0xffffffff;
      }
      iVar5 = (int)uVar13;
      if (bVar1 != bVar2) goto LAB_0015231b;
      lVar6 = lVar6 + 1;
      uVar12 = uVar13;
    } while (lVar6 != 0x21);
    iVar5 = 0;
LAB_0015231b:
    if (iVar5 != 0) goto LAB_00152711;
    if ((local_148 == 0x21) && (local_1d8[0x40] != local_128[0x40])) goto LAB_00152716;
    pubkey_00 = (secp256k1_ge *)local_128;
    if (bVar14 != 0) {
      if (local_1d8[0x40] != (char)uVar16) goto LAB_0015271b;
      psStack_1f0 = (secp256k1_ge *)0x15236f;
      ge_00 = &local_98;
      psVar11 = CTX;
      iVar5 = secp256k1_pubkey_load(CTX,&local_98,(secp256k1_pubkey *)pubkey_00);
      output = &local_98;
      if (iVar5 == 0) goto LAB_00152720;
      local_128._48_8_ = 0;
      local_128._56_8_ = 0;
      local_128._32_8_ = 0;
      local_128._40_4_ = 0;
      local_128._44_4_ = 0;
      local_128._16_8_ = 0;
      local_128._24_8_ = 0;
      local_128._0_8_ = 0;
      local_128._8_8_ = 0;
      local_1d8._0_8_ = 0x4d430001;
      local_1d8._16_8_ = 0x40;
      local_1d8._24_8_ = 0;
      local_1d8._32_8_ = 0;
      local_1d8._40_4_ = 0;
      local_1d8._44_4_ = 0;
      output = (secp256k1_ge *)local_1d8;
      local_1e0 = 0;
      psStack_1f0 = (secp256k1_ge *)0x1523f5;
      local_1d8._8_8_ = pubkey_00;
      secp256k1_ge_to_bytes((uchar *)pubkey_00,&local_98);
      local_1d8._48_8_ = 0x41;
      local_1d8._0_8_ = 0x4d430001;
      output_00 = (secp256k1_ge *)(local_1d8 + 0x40);
      local_1d8._16_8_ = 0x41;
      local_1d8._24_8_ = 0;
      local_1d8._32_8_ = 0;
      local_1d8._40_4_ = 0;
      local_1d8._44_4_ = 0;
      puVar10 = (undefined1 *)0x40;
      local_1e0 = 0;
      psStack_1f0 = (secp256k1_ge *)0x1524a5;
      ge_00 = output_00;
      psVar11 = CTX;
      local_1d8._8_8_ = output_00;
      iVar5 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output_00,(size_t *)(local_1d8 + 0x30),
                         (secp256k1_pubkey *)pubkey_00,2);
      if (iVar5 == 0) goto LAB_00152725;
      local_1d8._0_8_ = 0x4d430005;
      local_1d8._8_8_ = output_00;
      local_1d8._16_8_ = local_1d8._48_8_;
      local_1d8._24_8_ = 0;
      local_1d8._32_8_ = 0;
      local_1d8._40_4_ = 0;
      local_1d8._44_4_ = 0;
      uVar12 = (ulong)((long)psVar11 << 3) >> 0x33;
      uVar13 = (((long)psVar11 << 3 | (ulong)psVar11 >> 0x3d) << 0xd | uVar12) >> 3;
      psVar11 = (secp256k1_context *)(uVar13 << 0x33 | (uVar12 << 0x3d | uVar13) >> 0xd);
      puVar10 = (undefined1 *)0x40;
      local_1e0 = 0;
      if (local_1d8._48_8_ != 0x41) goto LAB_0015272a;
      psVar15 = output_00;
      if (local_1d8[0x40] != '\x04') goto LAB_0015272f;
      lVar6 = 0;
      puVar10 = (undefined1 *)(ulong)(uint)local_1d8._60_4_;
      do {
        bVar14 = abStack_197[lVar6];
        ge_00 = (secp256k1_ge *)(ulong)bVar14;
        bVar1 = *(uchar *)((long)(((secp256k1_ge *)input)->x).n + lVar6);
        psVar11 = (secp256k1_context *)(ulong)bVar1;
        iVar5 = (uint)bVar14 - (uint)bVar1;
        if (bVar14 != bVar1) goto LAB_00152543;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      iVar5 = 0;
LAB_00152543:
      if (iVar5 == 0) goto LAB_001526ae;
      goto LAB_00152734;
    }
LAB_001526ae:
    unaff_R12 = local_128;
    uVar9 = (int)puVar10 + 1;
    puVar10 = (undefined1 *)(ulong)uVar9;
    if (uVar9 == 0x100) goto LAB_001526d4;
  }
  local_128._48_8_ = 0xfefefefefefefefe;
  local_128._56_8_ = 0xfefefefefefefefe;
  local_128._32_8_ = 0xfefefefefefefefe;
  local_128._40_4_ = -0x1010102;
  local_128._44_4_ = -0x1010102;
  local_128._16_8_ = 0xfefefefefefefefe;
  local_128._24_8_ = 0xfefefefefefefefe;
  local_128._0_8_ = 0xfefefefefefefefe;
  local_128._8_8_ = 0xfefefefefefefefe;
  stack0xfffffffffffffe68 = (_func_void_char_ptr_void_ptr *)0x4d430001;
  pubkey_00 = (secp256k1_ge *)local_128;
  local_188 = 0x40;
  local_180._0_4_ = 0;
  local_180._4_4_ = 0;
  local_178._0_4_ = 0;
  local_178._4_4_ = 0;
  local_170 = 0;
  local_1d8._0_8_ = 0;
  psStack_1f0 = (secp256k1_ge *)0x1525de;
  ge_00 = pubkey_00;
  psStack_190 = pubkey_00;
  iVar5 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)pubkey_00,local_128 + 0x40,local_148);
  psVar4 = CTX;
  if (iVar5 != 0) {
    psStack_1f0 = (secp256k1_ge *)0x1526f8;
    ec_pubkey_parse_pointtest_cold_1();
    goto LAB_001526f8;
  }
  local_188 = 0x40;
  local_180._0_4_ = 0;
  local_180._4_4_ = 0;
  local_178._0_4_ = 0;
  local_178._4_4_ = 0;
  local_170 = 0;
  local_1d8._0_8_ = 0;
  unique0x10000863 = (CTX->illegal_callback).fn;
  psStack_190 = (secp256k1_ge *)(CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) {
    psStack_1f0 = (secp256k1_ge *)0x1526d2;
    (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
  }
  else {
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar4->illegal_callback).data = local_1d8;
  }
  ge_00 = &local_98;
  psStack_1f0 = (secp256k1_ge *)0x152683;
  psVar11 = CTX;
  iVar5 = secp256k1_pubkey_load(CTX,ge_00,(secp256k1_pubkey *)pubkey_00);
  psVar4 = CTX;
  if (iVar5 != 0) goto LAB_00152702;
  (CTX->illegal_callback).fn = stack0xfffffffffffffe68;
  (psVar4->illegal_callback).data = psStack_190;
  if (local_1d8._0_4_ == 1) goto LAB_001526ae;
LAB_00152707:
  psStack_1f0 = (secp256k1_ge *)0x15270c;
  ec_pubkey_parse_pointtest_cold_3();
  psVar15 = (secp256k1_ge *)input;
LAB_0015270c:
  input = (uchar *)psVar15;
  psStack_1f0 = (secp256k1_ge *)0x152711;
  ec_pubkey_parse_pointtest_cold_4();
LAB_00152711:
  psStack_1f0 = (secp256k1_ge *)0x152716;
  ec_pubkey_parse_pointtest_cold_5();
LAB_00152716:
  psStack_1f0 = (secp256k1_ge *)0x15271b;
  ec_pubkey_parse_pointtest_cold_12();
LAB_0015271b:
  psStack_1f0 = (secp256k1_ge *)0x152720;
  ec_pubkey_parse_pointtest_cold_6();
LAB_00152720:
  psStack_1f0 = (secp256k1_ge *)0x152725;
  ec_pubkey_parse_pointtest_cold_11();
LAB_00152725:
  psStack_1f0 = (secp256k1_ge *)0x15272a;
  ec_pubkey_parse_pointtest_cold_10();
LAB_0015272a:
  psStack_1f0 = (secp256k1_ge *)0x15272f;
  ec_pubkey_parse_pointtest_cold_7();
  psVar15 = output_00;
LAB_0015272f:
  output_00 = output;
  psStack_1f0 = (secp256k1_ge *)0x152734;
  ec_pubkey_parse_pointtest_cold_8();
LAB_00152734:
  psStack_1f0 = (secp256k1_ge *)test_sort_helper;
  ec_pubkey_parse_pointtest_cold_9();
  psStack_1f0 = (secp256k1_ge *)input;
  puStack_1f8 = puVar10;
  if (n_pubkeys != 0) {
    sVar7 = 0;
    do {
      apsStack_220[sVar7] =
           (secp256k1_pubkey *)
           ((&(psVar11->ecmult_gen_ctx).scalar_offset)[(ge_00->x).n[sVar7] * 2 + -1].d + 3);
      sVar7 = sVar7 + 1;
    } while (n_pubkeys != sVar7);
  }
  pcStack_228 = (code *)0x152776;
  secp256k1_ec_pubkey_sort(CTX,apsStack_220,n_pubkeys);
  if (n_pubkeys != 0) {
    sVar7 = 0;
    psVar8 = extraout_RDX;
    do {
      message = apsStack_220[sVar7];
      sigs = (secp256k1_scalar *)0x0;
      sigr = psVar8;
      do {
        sigr = (secp256k1_scalar *)((ulong)sigr & 0xffffffff);
        bVar14 = *(byte *)((long)sigs->d + (long)message->data);
        recid = (int *)(ulong)bVar14;
        bVar1 = *(byte *)((long)sigs->d + (long)&psVar11->ecmult_gen_ctx);
        psVar8 = (secp256k1_scalar *)(ulong)((uint)bVar14 - (uint)bVar1);
        if (bVar14 != bVar1) goto LAB_001527a8;
        sigs = (secp256k1_scalar *)((long)sigs->d + 1);
      } while (sigs != (secp256k1_scalar *)0x40);
      psVar8 = (secp256k1_scalar *)0x0;
LAB_001527a8:
      if ((int)psVar8 != 0) {
        pcStack_228 = random_sign;
        test_sort_helper_cold_1();
        pcStack_228 = (code *)0x0;
        psStack_248 = pubkey_00;
        psStack_240 = output_00;
        psStack_238 = psVar11;
        psStack_230 = psVar15;
        do {
          testutil_random_scalar_order_test(&sStack_270);
          iVar5 = secp256k1_ecdsa_sig_sign
                            (&CTX->ecmult_gen_ctx,sigr,sigs,seckey,(secp256k1_scalar *)message,
                             &sStack_270,recid);
        } while (iVar5 == 0);
        return;
      }
      sVar7 = sVar7 + 1;
      psVar11 = (secp256k1_context *)((psVar11->ecmult_gen_ctx).ge_offset.x.n + 3);
    } while (sVar7 != n_pubkeys);
  }
  return;
LAB_001526d4:
  local_148 = local_148 + 1;
  if (local_148 == 0x42) {
    return;
  }
  goto LAB_00151fdc;
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}